

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::lazyPrintRunInfo(ConsoleReporter *this)

{
  TestRunInfo *pTVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  Colour colour;
  
  poVar4 = (this->super_StreamingReporterBase).stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (getLineOfChars<(char)126>()::line == '\0') {
    uRam00000000001b0970 = 0x7e7e7e7e7e7e7e;
    uRam00000000001b0977 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001b0960 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b0968 = 0x7e7e7e7e7e7e7e;
    DAT_001b096f = 0x7e;
    _DAT_001b0950 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b0958 = 0x7e7e7e7e7e7e7e7e;
    _DAT_001b0940 = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b0948 = 0x7e7e7e7e7e7e7e7e;
    _line = 0x7e7e7e7e7e7e7e7e;
    uRam00000000001b0938 = 0x7e7e7e7e7e7e7e7e;
    DAT_001b097f = 0;
  }
  sVar3 = strlen(&getLineOfChars<(char)126>()::line);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,&getLineOfChars<(char)126>()::line,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  Colour::use(FileName);
  pTVar1 = (this->super_StreamingReporterBase).currentTestRunInfo.super_Option<Catch::TestRunInfo>.
           nullableValue;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((this->super_StreamingReporterBase).stream,(pTVar1->name)._M_dataplus._M_p,
                      (pTVar1->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," is a Catch v",0xd);
  operator<<(poVar4,(Version *)libraryVersion);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," host application.\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Run with -? for options\n\n",0x19);
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xf])();
  if (iVar2 != 0) {
    poVar4 = (this->super_StreamingReporterBase).stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Randomness seeded to: ",0x16);
    (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
      _vptr_NonCopyable[0xf])();
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n\n",2);
  }
  (this->super_StreamingReporterBase).currentTestRunInfo.used = true;
  Colour::use(None);
  return;
}

Assistant:

void lazyPrintRunInfo() {
            stream  << "\n" << getLineOfChars<'~'>() << "\n";
            Colour colour( Colour::SecondaryText );
            stream  << currentTestRunInfo->name
                    << " is a Catch v"  << libraryVersion << " host application.\n"
                    << "Run with -? for options\n\n";

            if( m_config->rngSeed() != 0 )
                stream << "Randomness seeded to: " << m_config->rngSeed() << "\n\n";

            currentTestRunInfo.used = true;
        }